

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getGLFormat(CompressedTexFormat format)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  CompressedTexFormat local_10;
  deUint32 local_c;
  CompressedTexFormat format_local;
  
  switch(format) {
  case COMPRESSEDTEXFORMAT_ETC1_RGB8:
    local_c = 0x8d64;
    break;
  case COMPRESSEDTEXFORMAT_EAC_R11:
    local_c = 0x9270;
    break;
  case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
    local_c = 0x9271;
    break;
  case COMPRESSEDTEXFORMAT_EAC_RG11:
    local_c = 0x9272;
    break;
  case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
    local_c = 0x9273;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_RGB8:
    local_c = 0x9274;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
    local_c = 0x9275;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
    local_c = 0x9276;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
    local_c = 0x9277;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
    local_c = 0x9278;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
    local_c = 0x9279;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:
    local_c = 0x93b0;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:
    local_c = 0x93b1;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:
    local_c = 0x93b2;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:
    local_c = 0x93b3;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:
    local_c = 0x93b4;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:
    local_c = 0x93b5;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:
    local_c = 0x93b6;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:
    local_c = 0x93b7;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:
    local_c = 0x93b8;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:
    local_c = 0x93b9;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:
    local_c = 0x93ba;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:
    local_c = 0x93bb;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:
    local_c = 0x93bc;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:
    local_c = 0x93bd;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:
    local_c = 0x93d0;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:
    local_c = 0x93d1;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:
    local_c = 0x93d2;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:
    local_c = 0x93d3;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:
    local_c = 0x93d4;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:
    local_c = 0x93d5;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:
    local_c = 0x93d6;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:
    local_c = 0x93d7;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:
    local_c = 0x93d8;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:
    local_c = 0x93d9;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:
    local_c = 0x93da;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:
    local_c = 0x93db;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:
    local_c = 0x93dc;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:
    local_c = 0x93dd;
    break;
  default:
    local_10 = format;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Can\'t map compressed format to GL format",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

deUint32 getGLFormat (tcu::CompressedTexFormat format)
{
	switch (format)
	{
		case tcu::COMPRESSEDTEXFORMAT_ETC1_RGB8:						return GL_ETC1_RGB8_OES;
		case tcu::COMPRESSEDTEXFORMAT_EAC_R11:							return GL_COMPRESSED_R11_EAC;
		case tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:					return GL_COMPRESSED_SIGNED_R11_EAC;
		case tcu::COMPRESSEDTEXFORMAT_EAC_RG11:							return GL_COMPRESSED_RG11_EAC;
		case tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:					return GL_COMPRESSED_SIGNED_RG11_EAC;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8:						return GL_COMPRESSED_RGB8_ETC2;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8:						return GL_COMPRESSED_SRGB8_ETC2;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:	return GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:	return GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:					return GL_COMPRESSED_RGBA8_ETC2_EAC;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC;

		case tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:					return GL_COMPRESSED_RGBA_ASTC_4x4_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:					return GL_COMPRESSED_RGBA_ASTC_5x4_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:					return GL_COMPRESSED_RGBA_ASTC_5x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:					return GL_COMPRESSED_RGBA_ASTC_6x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:					return GL_COMPRESSED_RGBA_ASTC_6x6_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:					return GL_COMPRESSED_RGBA_ASTC_8x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:					return GL_COMPRESSED_RGBA_ASTC_8x6_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:					return GL_COMPRESSED_RGBA_ASTC_8x8_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:					return GL_COMPRESSED_RGBA_ASTC_10x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:					return GL_COMPRESSED_RGBA_ASTC_10x6_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:					return GL_COMPRESSED_RGBA_ASTC_10x8_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:					return GL_COMPRESSED_RGBA_ASTC_10x10_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:					return GL_COMPRESSED_RGBA_ASTC_12x10_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:					return GL_COMPRESSED_RGBA_ASTC_12x12_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10_KHR;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:			return GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12_KHR;

		default:
			throw tcu::InternalError("Can't map compressed format to GL format");
	}
}